

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          string *aliasName,string *firstArg)

{
  char *pcVar1;
  bool bVar2;
  __type_conflict _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar2 = std::operator==(commandName,"vkGetInstanceProcAddr");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&bStack_148);
  }
  else {
    std::operator+(&local_48,"      ",commandName);
    std::operator+(&local_88,&local_48," = PFN_");
    std::operator+(&local_68,&local_88,commandName);
    std::operator+(&local_128,&local_68,"( vkGet");
    bVar2 = std::operator==(firstArg,"device");
    pcVar1 = "VkInstance";
    if (bVar2) {
      pcVar1 = "VkDevice";
    }
    std::operator+(&local_108,&local_128,pcVar1 + 2);
    std::operator+(&local_e8,&local_108,"ProcAddr( ");
    std::operator+(&local_c8,&local_e8,firstArg);
    std::operator+(&local_a8,&local_c8,", \"");
    std::operator+(&bStack_148,&local_a8,commandName);
    std::operator+(__return_storage_ptr__,&bStack_148,"\" ) );\n");
    std::__cxx11::string::~string((string *)&bStack_148);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    _Var3 = std::operator==(commandName,aliasName);
    if (!_Var3) {
      std::operator+(&local_128,"      if ( !",aliasName);
      std::operator+(&local_108,&local_128," ) ");
      std::operator+(&local_e8,&local_108,aliasName);
      std::operator+(&local_c8,&local_e8," = ");
      std::operator+(&local_a8,&local_c8,commandName);
      std::operator+(&bStack_148,&local_a8,";\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&bStack_148);
      std::__cxx11::string::~string((string *)&bStack_148);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment( std::string const & commandName,
                                                                                std::string const & aliasName,
                                                                                std::string const & firstArg ) const
{
  if ( commandName == "vkGetInstanceProcAddr" )
  {
    // Don't overwite vkGetInstanceProcAddr with NULL.
    return "";
  }
  std::string str = "      " + commandName + " = PFN_" + commandName + "( vkGet" + ( ( firstArg == "device" ) ? "Device" : "Instance" ) + "ProcAddr( " +
                    firstArg + ", \"" + commandName + "\" ) );\n";
  // if this is an alias'ed function, use it as a fallback for the original one
  if ( commandName != aliasName )
  {
    str += "      if ( !" + aliasName + " ) " + aliasName + " = " + commandName + ";\n";
  }
  return str;
}